

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft.c
# Opt level: O0

t_int * sigframp_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  t_sample *ptVar3;
  int *piVar4;
  int iVar5;
  t_sample tVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float local_68;
  t_sample detune;
  t_sample freq;
  t_sample pow;
  t_sample im;
  t_sample re;
  t_sample oneovern2;
  t_sample fbin;
  int m;
  int n;
  t_sample nextimag;
  t_sample currentimag;
  t_sample lastimag;
  t_sample nextreal;
  t_sample currentreal;
  t_sample lastreal;
  t_sample *outamp;
  t_sample *outfreq;
  t_sample *inimag;
  t_sample *inreal;
  t_int *w_local;
  
  ptVar3 = (t_sample *)w[1];
  piVar4 = (int *)w[2];
  outamp = (t_sample *)w[3];
  _currentreal = (float *)w[4];
  lastimag = *ptVar3;
  currentimag = ptVar3[1];
  n = *piVar4;
  m = piVar4[1];
  iVar7 = (int)w[5];
  oneovern2 = (t_sample)(iVar7 + 1);
  re = 1.0;
  *outamp = 0.0;
  *_currentreal = 0.0;
  fbin = (t_sample)(iVar7 + -2);
  outfreq = (t_sample *)(piVar4 + 2);
  inimag = ptVar3 + 2;
  while( true ) {
    tVar6 = lastimag;
    iVar5 = n;
    outamp = outamp + 1;
    _currentreal = _currentreal + 1;
    if (fbin == 0.0) break;
    lastimag = currentimag;
    fVar1 = *inimag;
    n = m;
    fVar2 = *outfreq;
    fVar8 = (tVar6 + fVar1) * -0.5 + currentimag;
    fVar9 = ((float)iVar5 + fVar2) * -0.5 + (float)m;
    detune = fVar8 * fVar8 + fVar9 * fVar9;
    if (detune <= 1e-19) {
      detune = 0.0;
      local_68 = 0.0;
    }
    else {
      local_68 = ((tVar6 - fVar1) * fVar8 + ((float)iVar5 - fVar2) * fVar9) / (detune * 2.0);
      if ((2.0 < local_68) || (local_68 < -2.0)) {
        detune = 0.0;
        local_68 = 0.0;
      }
      else {
        local_68 = re + local_68;
      }
    }
    *outamp = local_68;
    *_currentreal = (1.0 / ((float)iVar7 * (float)iVar7)) * detune;
    re = re + 1.0;
    fbin = (t_sample)((int)fbin + -1);
    m = (int)fVar2;
    currentimag = fVar1;
    outfreq = outfreq + 1;
    inimag = inimag + 1;
  }
  while (oneovern2 != 0.0) {
    *outamp = 0.0;
    *_currentreal = 0.0;
    oneovern2 = (t_sample)((int)oneovern2 + -1);
    _currentreal = _currentreal + 1;
    outamp = outamp + 1;
  }
  return w + 6;
}

Assistant:

static t_int *sigframp_perform(t_int *w)
{
    t_sample *inreal = (t_sample *)(w[1]);
    t_sample *inimag = (t_sample *)(w[2]);
    t_sample *outfreq = (t_sample *)(w[3]);
    t_sample *outamp = (t_sample *)(w[4]);
    t_sample lastreal = 0, currentreal = inreal[0], nextreal = inreal[1];
    t_sample lastimag = 0, currentimag = inimag[0], nextimag = inimag[1];
    int n = (int)w[5];
    int m = n + 1;
    t_sample fbin = 1, oneovern2 = 1.f/((t_sample)n * (t_sample)n);

    inreal += 2;
    inimag += 2;
    *outamp++ = *outfreq++ = 0;
    n -= 2;
    while (n--)
    {
        t_sample re, im, pow, freq;
        lastreal = currentreal;
        currentreal = nextreal;
        nextreal = *inreal++;
        lastimag = currentimag;
        currentimag = nextimag;
        nextimag = *inimag++;
        re = currentreal - 0.5f * (lastreal + nextreal);
        im = currentimag - 0.5f * (lastimag + nextimag);
        pow = re * re + im * im;
        if (pow > 1e-19)
        {
            t_sample detune = ((lastreal - nextreal) * re +
                    (lastimag - nextimag) * im) / (2.0f * pow);
            if (detune > 2 || detune < -2) freq = pow = 0;
            else freq = fbin + detune;
        }
        else freq = pow = 0;
        *outfreq++ = freq;
        *outamp++ = oneovern2 * pow;
        fbin += 1.0f;
    }
    while (m--) *outamp++ = *outfreq++ = 0;
    return (w+6);
}